

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O1

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
          (DefaultShaderSourceStreamFactory *this,IReferenceCounters *pRefCounters,
          Char *SearchDirectories)

{
  char *pcVar1;
  char (*in_RCX) [20];
  char *pcVar2;
  String SearchPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  RefCountedObject<Diligent::IShaderSourceInputStreamFactory>::RefCountedObject<>
            ((RefCountedObject<Diligent::IShaderSourceInputStreamFactory> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>).
  super_RefCountedObject<Diligent::IShaderSourceInputStreamFactory>.
  super_IShaderSourceInputStreamFactory.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00948130;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((SearchDirectories != (Char *)0x0) && (*SearchDirectories != '\0')) {
    do {
      for (; *SearchDirectories == ';'; SearchDirectories = SearchDirectories + 1) {
      }
      pcVar2 = SearchDirectories;
      if (*SearchDirectories == '\0') break;
      do {
        pcVar1 = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
        if (*pcVar1 == ';') break;
      } while (*pcVar1 != '\0');
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,SearchDirectories,pcVar2);
      if ((char (*) [20])local_70._M_string_length == (char (*) [20])0x0) {
        FormatString<char[26],char[20]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"!SearchPath.empty()",in_RCX);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                   ,0x3e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      in_RCX = (char (*) [20])local_70._M_string_length;
      if (((local_70._M_dataplus._M_p + -1)[local_70._M_string_length] != '/') &&
         ((local_70._M_dataplus._M_p + -1)[local_70._M_string_length] != '\\')) {
        std::__cxx11::string::push_back((char)&local_70);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_SearchDirectories,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      SearchDirectories = pcVar2;
    } while (*pcVar2 != '\0');
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_SearchDirectories,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory(IReferenceCounters* pRefCounters, const Char* SearchDirectories) :
    ObjectBase<IShaderSourceInputStreamFactory>(pRefCounters)
{
    FileSystem::SplitPathList(SearchDirectories,
                              [&](const char* Path, size_t Len) //
                              {
                                  String SearchPath{Path, Len};
                                  VERIFY_EXPR(!SearchPath.empty());
                                  if (!FileSystem::IsSlash(SearchPath.back()))
                                      SearchPath.push_back(FileSystem::SlashSymbol);
                                  m_SearchDirectories.emplace_back(std::move(SearchPath));
                                  return true;
                              });
    m_SearchDirectories.push_back("");
}